

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STVar.cpp
# Opt level: O3

STVar * __thiscall jbcoin::detail::STVar::operator=(STVar *this,STVar *rhs)

{
  STVar *pSVar1;
  undefined8 *puVar2;
  STBase *pSVar3;
  
  if (rhs == this) {
    return this;
  }
  pSVar1 = (STVar *)this->p_;
  if (pSVar1 == this) {
    puVar2 = *(undefined8 **)&pSVar1->d_;
  }
  else {
    if (pSVar1 == (STVar *)0x0) goto LAB_001b4805;
    puVar2 = (undefined8 *)(*(long *)&pSVar1->d_ + 8);
  }
  (*(code *)*puVar2)();
LAB_001b4805:
  this->p_ = (STBase *)0x0;
  pSVar1 = (STVar *)rhs->p_;
  if (pSVar1 == rhs) {
    pSVar3 = (STBase *)(**(code **)(*(long *)&pSVar1->d_ + 0x18))(pSVar1,0x48,this);
    this->p_ = pSVar3;
  }
  else {
    this->p_ = (STBase *)pSVar1;
    rhs->p_ = (STBase *)0x0;
  }
  return this;
}

Assistant:

STVar&
STVar::operator= (STVar&& rhs)
{
    if (&rhs != this)
    {
        destroy();
        if (rhs.on_heap())
        {
            p_ = rhs.p_;
            rhs.p_ = nullptr;
        }
        else
        {
            p_ = rhs.p_->move(max_size, &d_);
        }
    }

    return *this;
}